

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O0

bool __thiscall
capnp::_::StructBuilder::getDataField<bool>(StructBuilder *this,StructDataOffset offset)

{
  byte bVar1;
  uint uVar2;
  byte *b;
  BitCount32 boffset;
  StructDataOffset offset_local;
  StructBuilder *this_local;
  
  bVar1 = *(byte *)((long)this->data + (ulong)(offset >> 3));
  uVar2 = unbound<unsigned_int>(1 << ((byte)offset & 7));
  return (bVar1 & uVar2) != 0;
}

Assistant:

inline bool StructBuilder::getDataField<bool>(StructDataOffset offset) {
  BitCount32 boffset = offset * (ONE * BITS / ELEMENTS);
  byte* b = reinterpret_cast<byte*>(data) + boffset / BITS_PER_BYTE;
  return (*reinterpret_cast<uint8_t*>(b) &
      unbound(ONE << (boffset % BITS_PER_BYTE / BITS))) != 0;
}